

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

TestCaseGroup * vkt::pipeline::createCacheTests(TestContext *testCtx)

{
  undefined8 uVar1;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  CacheTestParam *local_5a0;
  CacheTestParam *local_540;
  CacheTestParam *local_4e0;
  CacheTestParam *local_480;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  undefined1 local_3da;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  undefined1 local_38a;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  undefined1 local_340 [8];
  CacheTestParam testParam;
  VkShaderStageFlagBits testParamShaders [2];
  undefined1 local_308 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> miscTests;
  deUint32 i_3;
  undefined1 local_2e8 [8];
  CacheTestParam testParams_3 [1];
  VkShaderStageFlagBits testParamShaders0_3 [1];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> computeTests;
  deUint32 i_2;
  undefined1 local_298 [8];
  CacheTestParam testParams_2 [3];
  VkShaderStageFlagBits aVStack_218 [2];
  VkShaderStageFlagBits testParamShaders2_2 [4];
  VkShaderStageFlagBits testParamShaders1_2 [3];
  VkShaderStageFlagBits testParamShaders0_2 [2];
  undefined1 local_1e8 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> graphicsTests_2;
  deUint32 i_1;
  undefined1 local_1c8 [8];
  CacheTestParam testParams_1 [3];
  VkShaderStageFlagBits aVStack_148 [2];
  VkShaderStageFlagBits testParamShaders2_1 [4];
  VkShaderStageFlagBits testParamShaders1_1 [3];
  VkShaderStageFlagBits testParamShaders0_1 [2];
  undefined1 local_118 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> graphicsTests_1;
  deUint32 i;
  undefined1 local_f8 [8];
  CacheTestParam testParams [3];
  VkShaderStageFlagBits aVStack_78 [2];
  VkShaderStageFlagBits testParamShaders2 [4];
  VkShaderStageFlagBits local_60 [2];
  VkShaderStageFlagBits testParamShaders1 [3];
  VkShaderStageFlagBits testParamShaders0 [2];
  undefined1 local_40 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> graphicsTests;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> cacheTests;
  TestContext *testCtx_local;
  
  cacheTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    cacheTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"cache","pipeline cache tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &graphicsTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xb);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    cacheTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"graphics_tests","Test pipeline cache with graphics pipeline.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)testParamShaders0 + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40,pTVar2
            );
  stack0xffffffffffffffb0 = 0x1000000001;
  local_60[0] = VK_SHADER_STAGE_VERTEX_BIT;
  local_60[1] = VK_SHADER_STAGE_GEOMETRY_BIT;
  testParamShaders1[0] = VK_SHADER_STAGE_FRAGMENT_BIT;
  aVStack_78[0] = VK_SHADER_STAGE_VERTEX_BIT;
  aVStack_78[1] = VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
  testParamShaders2[0] = VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
  testParamShaders2[1] = VK_SHADER_STAGE_FRAGMENT_BIT;
  anon_unknown_0::CacheTestParam::CacheTestParam((CacheTestParam *)local_f8,testParamShaders1 + 2,2)
  ;
  anon_unknown_0::CacheTestParam::CacheTestParam
            ((CacheTestParam *)&testParams[0].m_shaderCount,local_60,3);
  anon_unknown_0::CacheTestParam::CacheTestParam
            ((CacheTestParam *)&testParams[1].m_shaderCount,aVStack_78,4);
  for (graphicsTests_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
       .m_data._12_4_ = 0;
      (uint)graphicsTests_1.
            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
            _12_4_ < 3;
      graphicsTests_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._12_4_ =
           graphicsTests_1.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _12_4_ + 1) {
    pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_40)->super_TestNode;
    pTVar4 = (TestNode *)
             anon_unknown_0::newTestCase<vkt::pipeline::(anonymous_namespace)::GraphicsCacheTest>
                       ((TestContext *)
                        cacheTests.
                        super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                        .m_data._8_8_,
                        (CacheTestParam *)
                        &testParams
                         [(ulong)(uint)graphicsTests_1.
                                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                       .m_data._12_4_ - 1].m_shaderCount);
    tcu::TestNode::addChild(pTVar3,pTVar4);
  }
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  local_480 = (CacheTestParam *)&testParams[2].m_shaderCount;
  do {
    local_480 = local_480 + -1;
    anon_unknown_0::CacheTestParam::~CacheTestParam(local_480);
  } while (local_480 != (CacheTestParam *)local_f8);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    cacheTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"pipeline_from_get_data",
             "Test pipeline cache with graphics pipeline.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)testParamShaders0_1 + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_118,
             pTVar2);
  stack0xfffffffffffffed8 = 0x1000000001;
  testParamShaders2_1[2] = VK_SHADER_STAGE_VERTEX_BIT;
  testParamShaders2_1[3] = VK_SHADER_STAGE_GEOMETRY_BIT;
  testParamShaders1_1[0] = VK_SHADER_STAGE_FRAGMENT_BIT;
  aVStack_148[0] = VK_SHADER_STAGE_VERTEX_BIT;
  aVStack_148[1] = VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
  testParamShaders2_1[0] = VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
  testParamShaders2_1[1] = VK_SHADER_STAGE_FRAGMENT_BIT;
  anon_unknown_0::CacheTestParam::CacheTestParam
            ((CacheTestParam *)local_1c8,testParamShaders1_1 + 2,2);
  anon_unknown_0::CacheTestParam::CacheTestParam
            ((CacheTestParam *)&testParams_1[0].m_shaderCount,testParamShaders2_1 + 2,3);
  anon_unknown_0::CacheTestParam::CacheTestParam
            ((CacheTestParam *)&testParams_1[1].m_shaderCount,aVStack_148,4);
  for (graphicsTests_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
       .m_data._12_4_ = 0;
      (uint)graphicsTests_2.
            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
            _12_4_ < 3;
      graphicsTests_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._12_4_ =
           graphicsTests_2.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _12_4_ + 1) {
    pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_118)->super_TestNode;
    pTVar4 = (TestNode *)
             anon_unknown_0::
             newTestCase<vkt::pipeline::(anonymous_namespace)::PipelineFromCacheTest>
                       ((TestContext *)
                        cacheTests.
                        super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                        .m_data._8_8_,
                        (CacheTestParam *)
                        &testParams_1
                         [(ulong)(uint)graphicsTests_2.
                                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                       .m_data._12_4_ - 1].m_shaderCount);
    tcu::TestNode::addChild(pTVar3,pTVar4);
  }
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_118)->super_TestNode;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  local_4e0 = (CacheTestParam *)&testParams_1[2].m_shaderCount;
  do {
    local_4e0 = local_4e0 + -1;
    anon_unknown_0::CacheTestParam::~CacheTestParam(local_4e0);
  } while (local_4e0 != (CacheTestParam *)local_1c8);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_118);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    cacheTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"pipeline_from_incomplete_get_data",
             "Test pipeline cache with graphics pipeline.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)testParamShaders0_2 + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1e8,
             pTVar2);
  stack0xfffffffffffffe08 = 0x1000000001;
  testParamShaders2_2[2] = VK_SHADER_STAGE_VERTEX_BIT;
  testParamShaders2_2[3] = VK_SHADER_STAGE_GEOMETRY_BIT;
  testParamShaders1_2[0] = VK_SHADER_STAGE_FRAGMENT_BIT;
  aVStack_218[0] = VK_SHADER_STAGE_VERTEX_BIT;
  aVStack_218[1] = VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
  testParamShaders2_2[0] = VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
  testParamShaders2_2[1] = VK_SHADER_STAGE_FRAGMENT_BIT;
  anon_unknown_0::CacheTestParam::CacheTestParam
            ((CacheTestParam *)local_298,testParamShaders1_2 + 2,2);
  anon_unknown_0::CacheTestParam::CacheTestParam
            ((CacheTestParam *)&testParams_2[0].m_shaderCount,testParamShaders2_2 + 2,3);
  anon_unknown_0::CacheTestParam::CacheTestParam
            ((CacheTestParam *)&testParams_2[1].m_shaderCount,aVStack_218,4);
  for (computeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
       m_data._12_4_ = 0;
      (uint)computeTests.
            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
            _12_4_ < 3;
      computeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._12_4_ =
           computeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _12_4_ + 1) {
    pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_1e8)->super_TestNode;
    pTVar4 = (TestNode *)
             anon_unknown_0::
             newTestCase<vkt::pipeline::(anonymous_namespace)::PipelineFromIncompleteCacheTest>
                       ((TestContext *)
                        cacheTests.
                        super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                        .m_data._8_8_,
                        (CacheTestParam *)
                        &testParams_2
                         [(ulong)(uint)computeTests.
                                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                       .m_data._12_4_ - 1].m_shaderCount);
    tcu::TestNode::addChild(pTVar3,pTVar4);
  }
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_1e8)->super_TestNode;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  local_540 = (CacheTestParam *)&testParams_2[2].m_shaderCount;
  do {
    local_540 = local_540 + -1;
    anon_unknown_0::CacheTestParam::~CacheTestParam(local_540);
  } while (local_540 != (CacheTestParam *)local_298);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1e8);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    cacheTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"compute_tests","Test pipeline cache with compute pipeline.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&testParams_3[0].m_shaderCount + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
             testParamShaders0_3,pTVar2);
  testParams_3[0].m_shaderCount._0_4_ = 0x20;
  anon_unknown_0::CacheTestParam::CacheTestParam
            ((CacheTestParam *)local_2e8,(VkShaderStageFlagBits *)&testParams_3[0].m_shaderCount,1);
  for (miscTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
       m_data._12_4_ = 0;
      miscTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
      ._12_4_ == 0;
      miscTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
      ._12_4_ = miscTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._12_4_ + 1) {
    pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         testParamShaders0_3)->super_TestNode;
    pTVar4 = (TestNode *)
             anon_unknown_0::newTestCase<vkt::pipeline::(anonymous_namespace)::ComputeCacheTest>
                       ((TestContext *)
                        cacheTests.
                        super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                        .m_data._8_8_,
                        (CacheTestParam *)
                        &testParams_3
                         [(ulong)(uint)miscTests.
                                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                       .m_data._12_4_ - 1].m_shaderCount);
    tcu::TestNode::addChild(pTVar3,pTVar4);
  }
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    testParamShaders0_3)->super_TestNode;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  local_5a0 = (CacheTestParam *)&testParams_3[0].m_shaderCount;
  do {
    local_5a0 = local_5a0 + -1;
    anon_unknown_0::CacheTestParam::~CacheTestParam(local_5a0);
  } while (local_5a0 != (CacheTestParam *)local_2e8);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
             testParamShaders0_3);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    cacheTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"misc_tests",
             "Misc tests that can not be categorized to other group.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)testParamShaders + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_308,
             pTVar2);
  testParam.m_shaderCount = 0x1000000001;
  anon_unknown_0::CacheTestParam::CacheTestParam
            ((CacheTestParam *)local_340,(VkShaderStageFlagBits *)&testParam.m_shaderCount,2);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_308)->super_TestNode;
  pTVar4 = (TestNode *)operator_new(0x98);
  uVar1 = cacheTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
          m_data._8_8_;
  local_38a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"merge_cache_test",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"Merge the caches test.",&local_389);
  anon_unknown_0::MergeCacheTest::MergeCacheTest
            ((MergeCacheTest *)pTVar4,(TestContext *)uVar1,&local_360,&local_388,
             (CacheTestParam *)local_340);
  local_38a = 0;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_308)->super_TestNode;
  pTVar4 = (TestNode *)operator_new(0x98);
  uVar1 = cacheTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
          m_data._8_8_;
  local_3da = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"cache_header_test",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"Cache header test.",&local_3d9);
  anon_unknown_0::CacheHeaderTest::CacheHeaderTest
            ((CacheHeaderTest *)pTVar4,(TestContext *)uVar1,&local_3b0,&local_3d8,
             (CacheTestParam *)local_340);
  local_3da = 0;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_308)->super_TestNode;
  pTVar4 = (TestNode *)operator_new(0x98);
  uVar1 = cacheTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
          m_data._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"invalid_size_test",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"Invalid size test.",&local_429);
  anon_unknown_0::InvalidSizeTest::InvalidSizeTest
            ((InvalidSizeTest *)pTVar4,(TestContext *)uVar1,&local_400,&local_428,
             (CacheTestParam *)local_340);
  tcu::TestNode::addChild(pTVar3,pTVar4);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_308)->super_TestNode;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  anon_unknown_0::CacheTestParam::~CacheTestParam((CacheTestParam *)local_340);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_308);
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createCacheTests (tcu::TestContext& testCtx)
{

	de::MovePtr<tcu::TestCaseGroup> cacheTests (new tcu::TestCaseGroup(testCtx, "cache", "pipeline cache tests"));

	// Graphics Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> graphicsTests (new tcu::TestCaseGroup(testCtx, "graphics_tests", "Test pipeline cache with graphics pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders1[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_GEOMETRY_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders2[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
			VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
			CacheTestParam(testParamShaders1, DE_LENGTH_OF_ARRAY(testParamShaders1)),
			CacheTestParam(testParamShaders2, DE_LENGTH_OF_ARRAY(testParamShaders2)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			graphicsTests->addChild(newTestCase<GraphicsCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(graphicsTests.release());
	}

	// Graphics Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> graphicsTests(new tcu::TestCaseGroup(testCtx, "pipeline_from_get_data", "Test pipeline cache with graphics pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders1[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_GEOMETRY_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders2[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
			VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
			CacheTestParam(testParamShaders1, DE_LENGTH_OF_ARRAY(testParamShaders1)),
			CacheTestParam(testParamShaders2, DE_LENGTH_OF_ARRAY(testParamShaders2)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			graphicsTests->addChild(newTestCase<PipelineFromCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(graphicsTests.release());
	}

	// Graphics Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> graphicsTests(new tcu::TestCaseGroup(testCtx, "pipeline_from_incomplete_get_data", "Test pipeline cache with graphics pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders1[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_GEOMETRY_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const VkShaderStageFlagBits testParamShaders2[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
			VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
			CacheTestParam(testParamShaders1, DE_LENGTH_OF_ARRAY(testParamShaders1)),
			CacheTestParam(testParamShaders2, DE_LENGTH_OF_ARRAY(testParamShaders2)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			graphicsTests->addChild(newTestCase<PipelineFromIncompleteCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(graphicsTests.release());
	}

	// Compute Pipeline Tests
	{
		de::MovePtr<tcu::TestCaseGroup> computeTests (new tcu::TestCaseGroup(testCtx, "compute_tests", "Test pipeline cache with compute pipeline."));

		const VkShaderStageFlagBits testParamShaders0[] =
		{
			VK_SHADER_STAGE_COMPUTE_BIT,
		};
		const CacheTestParam testParams[] =
		{
			CacheTestParam(testParamShaders0, DE_LENGTH_OF_ARRAY(testParamShaders0)),
		};

		for (deUint32 i = 0; i < DE_LENGTH_OF_ARRAY(testParams); i++)
			computeTests->addChild(newTestCase<ComputeCacheTest>(testCtx, &testParams[i]));

		cacheTests->addChild(computeTests.release());
	}

	// Misc Tests
	{
		de::MovePtr<tcu::TestCaseGroup> miscTests (new tcu::TestCaseGroup(testCtx, "misc_tests", "Misc tests that can not be categorized to other group."));

		const VkShaderStageFlagBits testParamShaders[] =
		{
			VK_SHADER_STAGE_VERTEX_BIT,
			VK_SHADER_STAGE_FRAGMENT_BIT,
		};

		const CacheTestParam testParam(testParamShaders, DE_LENGTH_OF_ARRAY(testParamShaders));
		miscTests->addChild(new MergeCacheTest(testCtx,
											   "merge_cache_test",
											   "Merge the caches test.",
											   &testParam));

		miscTests->addChild(new CacheHeaderTest(testCtx,
											   "cache_header_test",
											   "Cache header test.",
											   &testParam));

		miscTests->addChild(new InvalidSizeTest(testCtx,
												"invalid_size_test",
												"Invalid size test.",
												&testParam));

		cacheTests->addChild(miscTests.release());
	}

	return cacheTests.release();
}